

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

from_chars_result
duckdb_fast_float::from_chars<double>
          (char *first,char *last,double *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  from_chars_result fVar12;
  from_chars_result fVar13;
  from_chars_result fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  uint uVar18;
  byte bVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  double dVar28;
  ulong uVar29;
  ulong uVar30;
  byte *pbVar31;
  byte *pbVar32;
  byte *pbVar33;
  byte *pbVar34;
  byte *pbVar35;
  long lVar36;
  bool bVar37;
  bool bVar38;
  double dVar39;
  from_chars_result fVar40;
  adjusted_mantissa aVar41;
  
  if (first == last) {
    fVar40._8_8_ = 0x16;
    fVar40.ptr = first;
    return fVar40;
  }
  cVar1 = *first;
  pbVar26 = (byte *)first;
  if ((cVar1 == '-') &&
     ((pbVar26 = (byte *)(first + 1), pbVar26 == (byte *)last ||
      (*pbVar26 != decimal_separator && 9 < (byte)(*pbVar26 - 0x30))))) goto LAB_016595c1;
  uVar29 = 0;
  pbVar34 = pbVar26;
  while( true ) {
    pbVar33 = pbVar34;
    if (pbVar33 == (byte *)last) {
      lVar20 = (long)last - (long)pbVar26;
      pbVar34 = (byte *)0x0;
      pbVar32 = (byte *)last;
      goto LAB_016594e1;
    }
    bVar19 = *pbVar33;
    if (9 < (byte)(bVar19 - 0x30)) break;
    uVar29 = (uVar29 * 10 + (ulong)bVar19) - 0x30;
    pbVar34 = pbVar33 + 1;
    if (((pbVar34 != (byte *)last) && (*pbVar34 == 0x5f)) &&
       ((strict ||
        ((pbVar34 = pbVar33 + 2, pbVar34 == (byte *)last || (9 < (byte)(*pbVar34 - 0x30)))))))
    goto LAB_016595c1;
  }
  lVar20 = (long)pbVar33 - (long)pbVar26;
  pbVar32 = pbVar33;
  if (bVar19 == decimal_separator) {
    pbVar34 = pbVar33 + 1;
    pbVar35 = pbVar33 + 9;
    pbVar31 = pbVar34;
    if ((pbVar35 <= last) &&
       (uVar30 = *(long *)pbVar34 + 0xcfcfcfcfcfcfcfd0,
       ((*(long *)pbVar34 + 0x4646464646464646U | uVar30) & 0x8080808080808080) == 0)) {
      uVar30 = (uVar30 >> 8) + uVar30 * 10;
      uVar29 = ((uVar30 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                (uVar30 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar29 * 100000000;
      pbVar31 = pbVar35;
      if ((pbVar33 + 0x11 <= last) &&
         (uVar30 = *(long *)pbVar35 + 0xcfcfcfcfcfcfcfd0,
         ((*(long *)pbVar35 + 0x4646464646464646U | uVar30) & 0x8080808080808080) == 0)) {
        uVar30 = (uVar30 >> 8) + uVar30 * 10;
        uVar29 = ((uVar30 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar30 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar29 * 100000000;
        pbVar31 = pbVar33 + 0x11;
      }
    }
    lVar36 = 0;
    do {
      pbVar31 = pbVar31 + 2;
      while( true ) {
        pbVar35 = pbVar31 + -2;
        pbVar33 = (byte *)last;
        if ((pbVar35 == (byte *)last) || (pbVar33 = pbVar35, 9 < (byte)(*pbVar35 - 0x30))) {
          pbVar34 = pbVar34 + (lVar36 - (long)pbVar33);
          lVar20 = lVar20 - (long)pbVar34;
          goto LAB_016594e1;
        }
        uVar29 = (ulong)(byte)(*pbVar35 - 0x30) + uVar29 * 10;
        if ((pbVar31 + -1 != (byte *)last) && (pbVar31[-1] == 0x5f)) break;
        pbVar31 = pbVar31 + 1;
      }
    } while ((!strict) &&
            ((pbVar31 != (byte *)last && (lVar36 = lVar36 + 1, (byte)(*pbVar31 - 0x30) < 10))));
    goto LAB_016595c1;
  }
  pbVar34 = (byte *)0x0;
LAB_016594e1:
  if (lVar20 == 0) goto LAB_016595c1;
  if ((((fmt & scientific) == 0) || (pbVar33 == (byte *)last)) || ((*pbVar33 | 0x20) != 0x65)) {
    if ((fmt & general) == scientific) goto LAB_016595c1;
  }
  else {
    pbVar35 = pbVar33 + 1;
    if (pbVar35 == (byte *)last) {
LAB_0165953c:
      bVar38 = false;
    }
    else {
      if (*pbVar35 != 0x2d) {
        if (*pbVar35 == 0x2b) {
          pbVar35 = pbVar33 + 2;
        }
        goto LAB_0165953c;
      }
      pbVar35 = pbVar33 + 2;
      bVar38 = true;
    }
    if ((pbVar35 != (byte *)last) && ((byte)(*pbVar35 - 0x30) < 10)) {
      lVar23 = 0;
      do {
        pbVar33 = pbVar35;
        if ((pbVar33 == (byte *)last) || (9 < (byte)(*pbVar33 - 0x30))) {
          lVar36 = -lVar23;
          if (!bVar38) {
            lVar36 = lVar23;
          }
          pbVar34 = pbVar34 + lVar36;
          goto LAB_016595e3;
        }
        lVar36 = (ulong)(byte)(*pbVar33 - 0x30) + lVar23 * 10;
        if (0xffff < lVar23) {
          lVar36 = lVar23;
        }
        lVar23 = lVar36;
        pbVar35 = pbVar33 + 1;
      } while (((pbVar35 == (byte *)last) || (*pbVar35 != 0x5f)) ||
              ((!strict &&
               ((pbVar35 = pbVar33 + 2, pbVar35 != (byte *)last && ((byte)(*pbVar35 - 0x30) < 10))))
              ));
      goto LAB_016595c1;
    }
    if ((fmt & fixed) == 0) goto LAB_016595c1;
  }
  lVar36 = 0;
LAB_016595e3:
  pbVar35 = pbVar26;
  if (0x13 < lVar20) {
    for (; (pbVar35 != (byte *)last &&
           (bVar19 = *pbVar35, bVar19 == 0x30 || bVar19 == decimal_separator));
        pbVar35 = pbVar35 + 1) {
      lVar20 = lVar20 - (ulong)(bVar19 == 0x30);
    }
    if (0x13 < lVar20) {
      uVar29 = 0;
      do {
        pbVar35 = pbVar26;
        if ((999999999999999999 < uVar29) || (pbVar35 == (byte *)last)) {
          if (uVar29 < 1000000000000000000) {
LAB_01659a0d:
            pbVar26 = pbVar35 + lVar36;
            pbVar35 = pbVar35 + 1;
            do {
              pbVar26 = pbVar26 + 1;
              pbVar34 = pbVar26 + -(long)pbVar35;
              pbVar35 = pbVar35 + 2;
              while( true ) {
                bVar38 = true;
                if (((999999999999999999 < uVar29) || (pbVar35 + -2 == (byte *)last)) ||
                   (bVar19 = pbVar35[-2], 9 < (byte)(bVar19 - 0x30))) goto LAB_01659698;
                uVar29 = (uVar29 * 10 + (ulong)bVar19) - 0x30;
                if ((pbVar35 + -1 != (byte *)last) && (pbVar35[-1] == 0x5f)) break;
                pbVar34 = pbVar34 + -1;
                pbVar35 = pbVar35 + 1;
              }
            } while ((pbVar35 != (byte *)last) && ((byte)(*pbVar35 - 0x30) < 10));
            break;
          }
          pbVar34 = pbVar32 + (lVar36 - (long)pbVar35);
          bVar38 = true;
          goto LAB_01659698;
        }
        if (9 < (byte)(*pbVar35 - 0x30)) goto LAB_01659a0d;
        uVar29 = (uVar29 * 10 + (ulong)*pbVar35) - 0x30;
        pbVar26 = pbVar35 + 1;
      } while (((pbVar26 == (byte *)last) || (*pbVar26 != 0x5f)) ||
              ((!strict &&
               ((pbVar26 = pbVar35 + 2, pbVar26 != (byte *)last && ((byte)(*pbVar26 - 0x30) < 10))))
              ));
LAB_016595c1:
      fVar40 = detail::parse_infnan<double>(first,last,value);
      return fVar40;
    }
  }
  bVar38 = false;
LAB_01659698:
  iVar17 = (int)pbVar34;
  if (pbVar34 + -0x17 < (byte *)0xffffffffffffffd3) {
LAB_016596b6:
    if (uVar29 == 0) {
      uVar29 = 0;
LAB_0165979c:
      uVar30 = 0;
    }
    else {
      if ((long)pbVar34 < -0x156) goto LAB_0165979c;
      if ((long)pbVar34 < 0x135) goto LAB_016596f2;
      uVar30 = 0x7ff;
    }
    uVar21 = 0;
LAB_016597a2:
    if (!bVar38) goto LAB_016597ef;
LAB_016597a7:
    uVar29 = uVar29 + 1;
    uVar18 = 0;
    if ((long)pbVar34 < -0x156) {
LAB_016597d3:
      uVar27 = 0;
    }
    else {
      uVar27 = 0;
      uVar18 = 0;
      if (uVar29 != 0) {
        if (0x134 < (long)pbVar34) {
          uVar18 = 0x7ff;
          goto LAB_016597d3;
        }
        uVar27 = 0x3f;
        if (uVar29 != 0) {
          for (; uVar29 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        uVar29 = uVar29 << ((byte)(uVar27 ^ 0x3f) & 0x3f);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar29;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar17 * 2 + 0x2ac) * 8);
        auVar11 = auVar4 * auVar8;
        uVar22 = auVar11._8_8_;
        if ((~auVar11._8_4_ & 0x1ff) == 0) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar29;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                   (long)(iVar17 * 2 + 0x2ad) * 8);
          uVar29 = SUB168(auVar5 * auVar9,8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar29;
          auVar16 = auVar11 + auVar16;
          auVar11._8_8_ = uVar29;
          auVar11._0_8_ = auVar16._0_8_;
          uVar22 = auVar16._8_8_;
        }
        if ((pbVar34 + 0x1b < (byte *)0x53) || (auVar11._0_8_ != 0xffffffffffffffff)) {
          iVar17 = (((iVar17 * 0x3526a >> 0x10) - (int)(uVar27 ^ 0x3f)) -
                   (int)((long)uVar22 >> 0x3f)) + 0x43e;
          bVar19 = 9 - (char)((long)uVar22 >> 0x3f);
          uVar29 = uVar22 >> (bVar19 & 0x3f);
          if (iVar17 < 1) {
            uVar18 = 1 - iVar17;
            if (0x3f < uVar18) {
              uVar18 = 0;
              goto LAB_016597d3;
            }
            uVar29 = (uVar29 >> ((byte)uVar18 & 0x3f)) +
                     (ulong)((uVar29 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
            uVar27 = uVar29 >> 1;
            uVar18 = (uint)(uVar29 >> 0x35 != 0);
          }
          else {
            uVar27 = uVar29 & 0xfffffffffffffe;
            if (uVar29 << (bVar19 & 0x3f) != uVar22 || ((uint)uVar29 & 3) != 1) {
              uVar27 = uVar29;
            }
            if (1 < auVar11._0_8_) {
              uVar27 = uVar29;
            }
            if ((byte *)0x1b < pbVar34 + 4) {
              uVar27 = uVar29;
            }
            uVar29 = (ulong)((uint)uVar27 & 1);
            bVar38 = uVar29 + uVar27 >> 0x36 != 0;
            uVar27 = (uVar27 >> 1) + (uVar29 & uVar27) & 0x7fefffffffffffff;
            if (bVar38) {
              uVar27 = 0;
            }
            uVar18 = iVar17 + (uint)bVar38;
            if (0x7fe < uVar18) {
              uVar27 = 0;
              uVar18 = 0x7ff;
            }
          }
        }
        else {
          uVar27 = 0;
          uVar18 = 0xffffffff;
        }
      }
    }
    if (((uVar21 == uVar27) && (-1 < (int)(uint)uVar30)) && ((uint)uVar30 == uVar18))
    goto LAB_016597ef;
  }
  else {
    if (uVar29 < 0x20000000000001) {
      if (!bVar38) {
        if ((long)pbVar34 < 0) {
          dVar39 = (double)(long)uVar29 / *(double *)(powers_of_ten_double + (long)pbVar34 * -8);
        }
        else {
          dVar39 = (double)(long)uVar29 * *(double *)(powers_of_ten_double + (long)pbVar34 * 8);
        }
        fVar14._8_8_ = 0;
        fVar14.ptr = (char *)pbVar33;
        fVar13._8_8_ = 0;
        fVar13.ptr = (char *)pbVar33;
        *value = dVar39;
        if (cVar1 != '-') {
          return fVar13;
        }
        *value = -dVar39;
        return fVar14;
      }
      goto LAB_016596b6;
    }
LAB_016596f2:
    uVar30 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar27 = uVar29 << ((byte)(uVar30 ^ 0x3f) & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar27;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar17 * 2 + 0x2ac) * 8);
    auVar10 = auVar2 * auVar6;
    uVar21 = auVar10._8_8_;
    if ((~auVar10._8_4_ & 0x1ff) == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar27;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar17 * 2 + 0x2ad) * 8);
      uVar21 = SUB168(auVar3 * auVar7,8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar21;
      auVar15 = auVar10 + auVar15;
      auVar10._8_8_ = uVar21;
      auVar10._0_8_ = auVar15._0_8_;
      uVar21 = auVar15._8_8_;
    }
    if ((pbVar34 + 0x1b < (byte *)0x53) || (auVar10._0_8_ != 0xffffffffffffffff)) {
      iVar24 = (((iVar17 * 0x3526a >> 0x10) - (int)(uVar30 ^ 0x3f)) - (int)((long)uVar21 >> 0x3f)) +
               0x43e;
      bVar19 = 9 - (char)((long)uVar21 >> 0x3f);
      uVar30 = uVar21 >> (bVar19 & 0x3f);
      if (iVar24 < 1) {
        uVar18 = 1 - iVar24;
        if (0x3f < uVar18) goto LAB_0165979c;
        uVar21 = (uVar30 >> ((byte)uVar18 & 0x3f)) +
                 (ulong)((uVar30 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
        uVar30 = (ulong)(uVar21 >> 0x35 != 0);
        uVar21 = uVar21 >> 1;
      }
      else {
        uVar27 = uVar30 & 0xfffffffffffffe;
        if (uVar30 << (bVar19 & 0x3f) != uVar21 || ((uint)uVar30 & 3) != 1) {
          uVar27 = uVar30;
        }
        if (1 < auVar10._0_8_) {
          uVar27 = uVar30;
        }
        if ((byte *)0x1b < pbVar34 + 4) {
          uVar27 = uVar30;
        }
        uVar30 = (ulong)((uint)uVar27 & 1);
        bVar37 = uVar30 + uVar27 >> 0x36 != 0;
        uVar21 = (uVar27 >> 1) + (uVar30 & uVar27) & 0x7fefffffffffffff;
        if (bVar37) {
          uVar21 = 0;
        }
        uVar25 = iVar24 + (uint)bVar37;
        uVar18 = uVar25;
        if (0x7fe < uVar25) {
          uVar18 = 0x7ff;
        }
        uVar30 = (ulong)uVar18;
        if (0x7fe < uVar25) {
          uVar21 = 0;
        }
      }
      goto LAB_016597a2;
    }
    if (bVar38) {
      uVar30 = 0xffffffffffffffff;
      uVar21 = 0;
      goto LAB_016597a7;
    }
  }
  aVar41 = parse_long_mantissa<duckdb_fast_float::binary_format<double>>(first,last);
  uVar21 = aVar41.mantissa;
  uVar30 = (ulong)(uint)aVar41.power2;
LAB_016597ef:
  dVar28 = (double)(uVar30 << 0x34 | uVar21);
  dVar39 = (double)((ulong)dVar28 | 0x8000000000000000);
  if (cVar1 != '-') {
    dVar39 = dVar28;
  }
  *value = dVar39;
  fVar12._8_8_ = 0;
  fVar12.ptr = (char *)pbVar33;
  return fVar12;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}